

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

bool mjs::is_reserved(token_type t,version v)

{
  token_type *ptVar1;
  logic_error *this;
  undefined1 *puVar2;
  ulong uVar3;
  token_type *ptVar4;
  bool bVar5;
  
  if (v == es5) {
    puVar2 = es5_reserved_tokens;
    ptVar4 = (token_type *)&DAT_001a63ec;
  }
  else {
    if (v != es3) {
      if (v != es1) {
        this = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(this,"Invalid version");
        __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      uVar3 = 5;
      puVar2 = (undefined1 *)&DAT_001a6318;
      do {
        if (*(token_type *)((long)puVar2 + -8) == t) {
          puVar2 = (undefined1 *)((long)puVar2 + -8);
          goto LAB_001751cd;
        }
        if (*(token_type *)((long)puVar2 + -4) == t) {
          puVar2 = (undefined1 *)((long)puVar2 + -4);
          goto LAB_001751cd;
        }
        if (*(token_type *)puVar2 == t) goto LAB_001751cd;
        if (*(token_type *)((long)puVar2 + 4) == t) {
          puVar2 = (undefined1 *)((long)puVar2 + 4);
          goto LAB_001751cd;
        }
        uVar3 = uVar3 - 1;
        puVar2 = (undefined1 *)((long)puVar2 + 0x10);
      } while (1 < uVar3);
      puVar2 = es3_reserved_tokens;
LAB_001751cd:
      bVar5 = puVar2 == es3_reserved_tokens;
      goto LAB_001751d0;
    }
    puVar2 = es3_reserved_tokens;
    ptVar4 = (token_type *)&DAT_001a63cc;
  }
  ptVar1 = std::
           __find_if<mjs::token_type_const*,__gnu_cxx::__ops::_Iter_equals_val<mjs::token_type_const>>
                     (puVar2,ptVar4);
  bVar5 = ptVar1 == ptVar4;
LAB_001751d0:
  return !bVar5;
}

Assistant:

constexpr bool is_reserved(token_type t, version v) {
    return v == version::es1 ? find_token(t, es1_reserved_tokens) :
           v == version::es3 ? find_token(t, es3_reserved_tokens) :
           v == version::es5 ? find_token(t, es5_reserved_tokens) :
           throw std::logic_error{"Invalid version"};
}